

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O2

void __thiscall
gvr::TexturedMesh::resizeVertexList(TexturedMesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < vn) {
    uVar3 = (long)(vn * 2) * 4;
  }
  pfVar2 = (float *)operator_new__(uVar3);
  iVar5 = (this->super_Mesh).super_PointCloud.n;
  if (vn <= iVar5) {
    iVar5 = vn;
  }
  pfVar1 = this->uv;
  for (uVar3 = (ulong)(uint)(iVar5 * 2); 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    pfVar2[uVar3 - 1] = pfVar1[uVar3 - 1];
  }
  for (lVar4 = (long)(iVar5 * 2); lVar4 < vn * 2; lVar4 = lVar4 + 1) {
    pfVar2[lVar4] = 0.0;
  }
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  this->uv = pfVar2;
  Mesh::resizeVertexList(&this->super_Mesh,vn,with_scanprop,with_scanpos);
  return;
}

Assistant:

void TexturedMesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [2*vn];

  for (int i=2*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=uv[i];
  }

  for (int i=2*std::min(getVertexCount(), vn); i<2*vn; i++)
  {
    p[i]=0;
  }

  delete [] uv;

  uv=p;

  Mesh::resizeVertexList(vn, with_scanprop, with_scanpos);
}